

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

void __thiscall
ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>::basic_dynamic_counter
          (basic_dynamic_counter<double,_(unsigned_char)__x02_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint uVar6;
  undefined8 uVar7;
  uint uVar8;
  long lVar9;
  undefined8 *puVar10;
  allocator_type local_a9;
  string local_a8;
  string local_88;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_68;
  
  local_88._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (help->_M_dataplus)._M_p;
  paVar1 = &help->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == paVar1) {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&help->field_2 + 8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a8._M_string_length = help->_M_string_length;
  (help->_M_dataplus)._M_p = (pointer)paVar1;
  help->_M_string_length = 0;
  (help->field_2)._M_local_buf[0] = '\0';
  lVar9 = 0x10;
  do {
    puVar10 = (undefined8 *)((long)&local_68._M_elems[0]._M_dataplus._M_p + lVar9);
    puVar2 = (undefined8 *)((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar9);
    *(undefined8 **)((long)local_68._M_elems + lVar9 + -0x10) = puVar10;
    puVar4 = *(undefined8 **)((long)labels_name->_M_elems + lVar9 + -0x10);
    if (puVar2 == puVar4) {
      uVar7 = puVar2[1];
      *puVar10 = *puVar2;
      *(undefined8 *)((long)&local_68._M_elems[0]._M_string_length + lVar9) = uVar7;
    }
    else {
      *(undefined8 **)((long)local_68._M_elems + lVar9 + -0x10) = puVar4;
      *puVar10 = *puVar2;
    }
    *(undefined8 *)((long)local_68._M_elems + lVar9 + -8) =
         *(undefined8 *)((long)labels_name->_M_elems + lVar9 + -8);
    *(undefined8 **)((long)labels_name->_M_elems + lVar9 + -0x10) = puVar2;
    *(undefined8 *)((long)labels_name->_M_elems + lVar9 + -8) = 0;
    *(undefined1 *)((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar9) = 0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x50);
  metric_t::metric_t<2ul>((metric_t *)this,Counter,&local_88,&local_a8,&local_68);
  (this->super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>).super_dynamic_metric
  .super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_00202a10;
  uVar8 = std::thread::hardware_concurrency();
  uVar6 = 0x80;
  if (uVar8 < 0x80) {
    uVar6 = uVar8;
  }
  std::
  vector<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type>_>_>_>_>_>
  ::vector(&(this->super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>).map_.
            shards_,(ulong)uVar6,&local_a9);
  (this->super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>).map_.size_.
  super___atomic_base<long>._M_i = 0;
  lVar9 = 0;
  do {
    plVar5 = *(long **)((long)&local_68._M_elems[1]._M_dataplus._M_p + lVar9);
    plVar3 = (long *)(local_68._M_elems[1].field_2._M_local_buf + lVar9);
    if (plVar3 != plVar5) {
      operator_delete(plVar5,*plVar3 + 1);
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (this->super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>).super_dynamic_metric
  .super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_002029c0;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}